

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InertiaNonLinearParametrization.cpp
# Opt level: O0

Matrix<double,_3,_3,_0,_3,_3> * iDynTree::diag(Matrix<double,_3,_1,_0,_3,_1> *vec)

{
  double dVar1;
  CoeffReturnType pdVar2;
  Scalar *pSVar3;
  Matrix<double,_3,_3,_0,_3,_3> *in_RDI;
  Matrix<double,_3,_3,_0,_3,_3> *ret;
  Index in_stack_ffffffffffffffc8;
  double row;
  DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *in_stack_ffffffffffffffd0;
  DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *this;
  
  Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix((Matrix<double,_3,_3,_0,_3,_3> *)0x6a1520);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::setZero
            ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_ffffffffffffffd0);
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator()
                     (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  row = *pdVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                      in_stack_ffffffffffffffd0,(Index)row,0x6a1552);
  *pSVar3 = row;
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator()
                     (in_stack_ffffffffffffffd0,(Index)row);
  this = (DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)*pdVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,(Index)row,0x6a1586);
  *pSVar3 = (Scalar)this;
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)this,(Index)row);
  dVar1 = *pdVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,(Index)row,0x6a15bb);
  *pSVar3 = dVar1;
  return in_RDI;
}

Assistant:

Eigen::Matrix<double, 3, 3> diag(const Eigen::Matrix<double, 3, 1> & vec)
{
    Eigen::Matrix<double, 3, 3> ret;

    ret.setZero();

    ret(0,0) = vec(0);
    ret(1,1) = vec(1);
    ret(2,2) = vec(2);

    return ret;
}